

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct> *this,
                 vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *list)

{
  bool bVar1;
  DecodePsbtInput *in_RDI;
  DecodePsbtInput object;
  DecodePsbtInputStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *__range3;
  DecodePsbtInputStruct *in_stack_fffffffffffffb48;
  value_type *in_stack_fffffffffffffb58;
  vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
  *in_stack_fffffffffffffb60;
  DecodePsbtInput *in_stack_fffffffffffffbd0;
  __normal_iterator<const_DecodePsbtInputStruct_*,_std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (DecodePsbtInputStruct *)
       ::std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::begin
                 (in_stack_fffffffffffffb48);
  ::std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::end
            ((vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *)
             in_stack_fffffffffffffb48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_DecodePsbtInputStruct_*,_std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_DecodePsbtInputStruct_*,_std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>_>
                        *)in_stack_fffffffffffffb48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_DecodePsbtInputStruct_*,_std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>_>
    ::operator*(local_20);
    in_stack_fffffffffffffb48 = (DecodePsbtInputStruct *)&stack0xfffffffffffffb68;
    cfd::api::json::DecodePsbtInput::DecodePsbtInput(in_stack_fffffffffffffbd0);
    cfd::api::json::DecodePsbtInput::ConvertFromStruct(in_RDI,in_stack_fffffffffffffb48);
    ::std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
    ::push_back(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    cfd::api::json::DecodePsbtInput::~DecodePsbtInput(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_DecodePsbtInputStruct_*,_std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }